

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidateOneAttribute
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr,xmlChar *value)

{
  xmlAttributeType type;
  xmlNs *pxVar1;
  xmlHashTablePtr pxVar2;
  int iVar3;
  uint uVar4;
  xmlChar *key3;
  void *pvVar5;
  xmlIDPtr pxVar6;
  xmlRefPtr pxVar7;
  void *pvVar8;
  undefined8 *puVar9;
  long *plVar10;
  xmlChar *local_80;
  xmlChar fn [50];
  
  uVar4 = 0;
  if (doc != (xmlDocPtr)0x0) {
    if (doc->intSubset == (_xmlDtd *)0x0) {
      if (elem == (xmlNodePtr)0x0) {
        return 0;
      }
      if (doc->extSubset == (_xmlDtd *)0x0) {
        return 0;
      }
    }
    else if (elem == (xmlNodePtr)0x0) {
      return 0;
    }
    if ((attr != (xmlAttrPtr)0x0 && elem->name != (xmlChar *)0x0) &&
       (uVar4 = 0, attr->name != (xmlChar *)0x0)) {
      if (attr->ns == (xmlNs *)0x0) {
        local_80 = (xmlChar *)0x0;
      }
      else {
        local_80 = attr->ns->prefix;
      }
      pxVar1 = elem->ns;
      if ((pxVar1 == (xmlNs *)0x0) || (pxVar1->prefix == (xmlChar *)0x0)) {
        pvVar5 = (void *)0x0;
      }
      else {
        key3 = xmlBuildQName(elem->name,pxVar1->prefix,fn,0x32);
        if (key3 == (xmlChar *)0x0) {
          xmlVErrMemory(ctxt);
          pvVar5 = (void *)0x0;
        }
        else {
          if ((doc->intSubset == (_xmlDtd *)0x0) ||
             (pxVar2 = (xmlHashTablePtr)doc->intSubset->attributes, pxVar2 == (xmlHashTablePtr)0x0))
          {
            pvVar5 = (void *)0x0;
          }
          else {
            pvVar5 = xmlHashLookup3(pxVar2,attr->name,local_80,key3);
          }
          if (pvVar5 == (void *)0x0) {
            if ((doc->extSubset == (_xmlDtd *)0x0) ||
               (pxVar2 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar2 == (xmlHashTablePtr)0x0
               )) {
              pvVar5 = (void *)0x0;
            }
            else {
              pvVar5 = xmlHashLookup3(pxVar2,attr->name,local_80,key3);
            }
          }
          if ((key3 != fn) && (key3 != elem->name)) {
            (*xmlFree)(key3);
          }
        }
        if (key3 == (xmlChar *)0x0) {
          return 0;
        }
      }
      if (pvVar5 == (void *)0x0) {
        if ((doc->intSubset == (_xmlDtd *)0x0) ||
           (pxVar2 = (xmlHashTablePtr)doc->intSubset->attributes, pxVar2 == (xmlHashTablePtr)0x0)) {
          pvVar5 = (void *)0x0;
        }
        else {
          pvVar5 = xmlHashLookup3(pxVar2,attr->name,local_80,elem->name);
        }
        if (pvVar5 == (void *)0x0) {
          if ((doc->extSubset == (_xmlDtd *)0x0) ||
             (pxVar2 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar2 == (xmlHashTablePtr)0x0))
          {
            pvVar5 = (void *)0x0;
          }
          else {
            pvVar5 = xmlHashLookup3(pxVar2,attr->name,local_80,elem->name);
          }
        }
      }
      if (pvVar5 == (void *)0x0) {
        uVar4 = 0;
        xmlDoErrValid(ctxt,elem,XML_DTD_UNKNOWN_ATTRIBUTE,2,attr->name,elem->name,(xmlChar *)0x0,0,
                      "No declaration for attribute %s of element %s\n",attr->name,elem->name,0);
      }
      else {
        if (((attr->atype == XML_ATTRIBUTE_ID) && (attr->id != (_xmlID *)0x0)) &&
           ((xmlHashTablePtr)doc->ids != (xmlHashTablePtr)0x0)) {
          xmlHashRemoveEntry((xmlHashTablePtr)doc->ids,attr->id->value,xmlFreeIDTableEntry);
        }
        type = *(xmlAttributeType *)((long)pvVar5 + 0x50);
        attr->atype = type;
        iVar3 = xmlValidateAttributeValueInternal(doc,type,value);
        if (iVar3 == 0) {
          xmlDoErrValid(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,2,attr->name,elem->name,(xmlChar *)0x0,0,
                        "Syntax of value for attribute %s of %s is not valid\n",attr->name,
                        elem->name,0);
        }
        local_80._0_4_ = (uint)(iVar3 != 0);
        if ((*(int *)((long)pvVar5 + 0x54) == 4) &&
           (iVar3 = xmlStrEqual(value,*(xmlChar **)((long)pvVar5 + 0x58)), iVar3 == 0)) {
          local_80._0_4_ = 0;
          xmlDoErrValid(ctxt,elem,XML_DTD_ATTRIBUTE_DEFAULT,2,attr->name,elem->name,
                        *(xmlChar **)((long)pvVar5 + 0x58),0,
                        "Value for attribute %s of %s is different from default \"%s\"\n",attr->name
                        ,elem->name,*(xmlChar **)((long)pvVar5 + 0x58));
        }
        if (*(int *)((long)pvVar5 + 0x50) == 2) {
          pxVar6 = xmlAddID(ctxt,doc,value,attr);
          if (pxVar6 == (xmlIDPtr)0x0) {
            local_80._0_4_ = 0;
          }
        }
        if (*(int *)((long)pvVar5 + 0x50) - 3U < 2) {
          pxVar7 = xmlAddRef(ctxt,doc,value,attr);
          if (pxVar7 == (xmlRefPtr)0x0) {
            local_80._0_4_ = 0;
          }
        }
        if (*(int *)((long)pvVar5 + 0x50) == 10) {
          puVar9 = *(undefined8 **)((long)pvVar5 + 0x60);
          if ((((doc->intSubset == (_xmlDtd *)0x0) ||
               (pxVar2 = (xmlHashTablePtr)doc->intSubset->notations, pxVar2 == (xmlHashTablePtr)0x0)
               ) || (pvVar8 = xmlHashLookup(pxVar2,value), pvVar8 == (void *)0x0)) &&
             (((doc->extSubset == (_xmlDtd *)0x0 ||
               (pxVar2 = (xmlHashTablePtr)doc->extSubset->notations, pxVar2 == (xmlHashTablePtr)0x0)
               ) || (pvVar8 = xmlHashLookup(pxVar2,value), pvVar8 == (void *)0x0)))) {
            local_80._0_4_ = 0;
            xmlDoErrValid(ctxt,elem,XML_DTD_UNKNOWN_NOTATION,2,value,attr->name,elem->name,0,
                          "Value \"%s\" for attribute %s of %s is not a declared Notation\n",value,
                          attr->name,elem->name);
          }
          for (; puVar9 != (undefined8 *)0x0; puVar9 = (undefined8 *)*puVar9) {
            iVar3 = xmlStrEqual((xmlChar *)puVar9[1],value);
            if (iVar3 != 0) goto LAB_0015a52d;
          }
          local_80._0_4_ = 0;
          xmlDoErrValid(ctxt,elem,XML_DTD_NOTATION_VALUE,2,value,attr->name,elem->name,0,
                        "Value \"%s\" for attribute %s of %s is not among the enumerated notations\n"
                        ,value,attr->name,elem->name);
        }
LAB_0015a52d:
        if (*(int *)((long)pvVar5 + 0x50) == 9) {
          plVar10 = (long *)((long)pvVar5 + 0x60);
          do {
            plVar10 = (long *)*plVar10;
            if (plVar10 == (long *)0x0) {
              local_80._0_4_ = 0;
              xmlDoErrValid(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,2,value,attr->name,elem->name,0,
                            "Value \"%s\" for attribute %s of %s is not among the enumerated set\n",
                            value,attr->name,elem->name);
              break;
            }
            iVar3 = xmlStrEqual((xmlChar *)plVar10[1],value);
          } while (iVar3 == 0);
        }
        if ((*(int *)((long)pvVar5 + 0x54) == 4) &&
           (iVar3 = xmlStrEqual(*(xmlChar **)((long)pvVar5 + 0x58),value), iVar3 == 0)) {
          local_80._0_4_ = 0;
          xmlDoErrValid(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,2,attr->name,elem->name,
                        *(xmlChar **)((long)pvVar5 + 0x58),0,
                        "Value for attribute %s of %s must be \"%s\"\n",attr->name,elem->name,
                        *(xmlChar **)((long)pvVar5 + 0x58));
        }
        uVar4 = xmlValidateAttributeValue2
                          (ctxt,doc,attr->name,*(xmlAttributeType *)((long)pvVar5 + 0x50),value);
        uVar4 = uVar4 & (uint)local_80;
      }
    }
  }
  return uVar4;
}

Assistant:

int
xmlValidateOneAttribute(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                        xmlNodePtr elem, xmlAttrPtr attr, const xmlChar *value)
{
    xmlAttributePtr attrDecl =  NULL;
    const xmlChar *aprefix;
    int val;
    int ret = 1;

    CHECK_DTD;
    if ((elem == NULL) || (elem->name == NULL)) return(0);
    if ((attr == NULL) || (attr->name == NULL)) return(0);

    aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;

    if ((elem->ns != NULL) && (elem->ns->prefix != NULL)) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, elem->ns->prefix, fn, 50);
	if (fullname == NULL) {
            xmlVErrMemory(ctxt);
	    return(0);
        }
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullname,
                                      attr->name, aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullname,
                                          attr->name, aprefix);
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    if (attrDecl == NULL) {
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name,
                                      attr->name, aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name,
                                          attr->name, aprefix);
    }


    /* Validity Constraint: Attribute Value Type */
    if (attrDecl == NULL) {
	xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
	       "No declaration for attribute %s of element %s\n",
	       attr->name, elem->name, NULL);
	return(0);
    }
    if (attr->atype == XML_ATTRIBUTE_ID)
        xmlRemoveID(doc, attr);
    attr->atype = attrDecl->atype;

    val = xmlValidateAttributeValueInternal(doc, attrDecl->atype, value);
    if (val == 0) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
	   "Syntax of value for attribute %s of %s is not valid\n",
	       attr->name, elem->name, NULL);
        ret = 0;
    }

    /* Validity constraint: Fixed Attribute Default */
    if (attrDecl->def == XML_ATTRIBUTE_FIXED) {
	if (!xmlStrEqual(value, attrDecl->defaultValue)) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
	   "Value for attribute %s of %s is different from default \"%s\"\n",
		   attr->name, elem->name, attrDecl->defaultValue);
	    ret = 0;
	}
    }

    /* Validity Constraint: ID uniqueness */
    if (attrDecl->atype == XML_ATTRIBUTE_ID) {
        if (xmlAddID(ctxt, doc, value, attr) == NULL)
	    ret = 0;
    }

    if ((attrDecl->atype == XML_ATTRIBUTE_IDREF) ||
	(attrDecl->atype == XML_ATTRIBUTE_IDREFS)) {
        if (xmlAddRef(ctxt, doc, value, attr) == NULL)
	    ret = 0;
    }

    /* Validity Constraint: Notation Attributes */
    if (attrDecl->atype == XML_ATTRIBUTE_NOTATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
        xmlNotationPtr nota;

        /* First check that the given NOTATION was declared */
	nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	if (nota == NULL)
	    nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	if (nota == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute %s of %s is not a declared Notation\n",
		   value, attr->name, elem->name);
	    ret = 0;
        }

	/* Second, verify that it's among the list */
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute %s of %s is not among the enumerated notations\n",
		   value, attr->name, elem->name);
	    ret = 0;
	}
    }

    /* Validity Constraint: Enumeration */
    if (attrDecl->atype == XML_ATTRIBUTE_ENUMERATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
       "Value \"%s\" for attribute %s of %s is not among the enumerated set\n",
		   value, attr->name, elem->name);
	    ret = 0;
	}
    }

    /* Fixed Attribute Default */
    if ((attrDecl->def == XML_ATTRIBUTE_FIXED) &&
        (!xmlStrEqual(attrDecl->defaultValue, value))) {
	xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
	   "Value for attribute %s of %s must be \"%s\"\n",
	       attr->name, elem->name, attrDecl->defaultValue);
        ret = 0;
    }

    /* Extra check for the attribute value */
    ret &= xmlValidateAttributeValue2(ctxt, doc, attr->name,
				      attrDecl->atype, value);

    return(ret);
}